

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_ParallelContext.cpp
# Opt level: O2

void __thiscall
amrex::ParallelContext::Frame::local_to_global_rank(Frame *this,int *global,int *local,size_t n)

{
  size_t i;
  
  for (i = 0; n != i; i = i + 1) {
    global[i] = 0;
  }
  return;
}

Assistant:

void
Frame::local_to_global_rank (int* global, const int* local, std::size_t n) const
{
#ifdef BL_USE_MPI
    if (frames.size() > 1)
    {
      MPI_Group_translate_ranks(GroupSub(), n, const_cast<int*>(local), GroupAll(), global);
    }
    else
    {
        for (std::size_t i = 0; i < n; ++i) global[i] = local[i];
    }
#else
    amrex::ignore_unused(local);
    for (std::size_t i = 0; i < n; ++i) global[i] = 0;
#endif
}